

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# densehashtable.h
# Opt level: O3

iterator * __thiscall
google::
dense_hashtable<std::pair<HashObject<8,8>const,int>,HashObject<8,8>,HashFn,google::dense_hash_map<HashObject<8,8>,int,HashFn,std::equal_to<HashObject<8,8>>,google::libc_allocator_with_realloc<std::pair<HashObject<8,8>const,int>>>::SelectKey,google::dense_hash_map<HashObject<8,8>,int,HashFn,std::equal_to<HashObject<8,8>>,google::libc_allocator_with_realloc<std::pair<HashObject<8,8>const,int>>>::SetKey,std::equal_to<HashObject<8,8>>,google::libc_allocator_with_realloc<std::pair<HashObject<8,8>const,int>>>
::insert_at<HashObject<8,8>,int>
          (iterator *__return_storage_ptr__,
          dense_hashtable<std::pair<HashObject<8,8>const,int>,HashObject<8,8>,HashFn,google::dense_hash_map<HashObject<8,8>,int,HashFn,std::equal_to<HashObject<8,8>>,google::libc_allocator_with_realloc<std::pair<HashObject<8,8>const,int>>>::SelectKey,google::dense_hash_map<HashObject<8,8>,int,HashFn,std::equal_to<HashObject<8,8>>,google::libc_allocator_with_realloc<std::pair<HashObject<8,8>const,int>>>::SetKey,std::equal_to<HashObject<8,8>>,google::libc_allocator_with_realloc<std::pair<HashObject<8,8>const,int>>>
          *this,size_type pos,HashObject<8,_8> *args,int *args_1)

{
  long lVar1;
  long lVar2;
  long lVar3;
  length_error *this_00;
  
  lVar1 = *(long *)(this + 0x30);
  if ((ulong)(*(long *)(this + 0x38) - lVar1) < 0x1555555555555555) {
    lVar2 = *(long *)(this + 0x50);
    if ((lVar1 == 0) || (*(int *)(this + 0x20) != *(int *)(lVar2 + pos * 0xc))) {
      *(long *)(this + 0x38) = *(long *)(this + 0x38) + 1;
    }
    else {
      *(long *)(this + 0x30) = lVar1 + -1;
    }
    g_num_copies = g_num_copies + 1;
    lVar3 = pos * 0xc;
    *(int *)(lVar2 + lVar3) = args->i_;
    *(undefined4 *)(lVar2 + 4 + lVar3) = *(undefined4 *)args->buffer_;
    *(int *)(lVar2 + 8 + lVar3) = *args_1;
    lVar1 = *(long *)(this + 0x40);
    lVar2 = *(long *)(this + 0x50);
    __return_storage_ptr__->ht =
         (dense_hashtable<std::pair<const_HashObject<8,_8>,_int>,_HashObject<8,_8>,_HashFn,_google::dense_hash_map<HashObject<8,_8>,_int,_HashFn,_std::equal_to<HashObject<8,_8>_>,_google::libc_allocator_with_realloc<std::pair<const_HashObject<8,_8>,_int>_>_>::SelectKey,_google::dense_hash_map<HashObject<8,_8>,_int,_HashFn,_std::equal_to<HashObject<8,_8>_>,_google::libc_allocator_with_realloc<std::pair<const_HashObject<8,_8>,_int>_>_>::SetKey,_std::equal_to<HashObject<8,_8>_>,_google::libc_allocator_with_realloc<std::pair<const_HashObject<8,_8>,_int>_>_>
          *)this;
    __return_storage_ptr__->pos = (pointer)(lVar3 + lVar2);
    __return_storage_ptr__->end = (pointer)(lVar2 + lVar1 * 0xc);
    return __return_storage_ptr__;
  }
  this_00 = (length_error *)__cxa_allocate_exception(0x10);
  std::length_error::length_error(this_00,"insert overflow");
  __cxa_throw(this_00,&std::length_error::typeinfo,std::length_error::~length_error);
}

Assistant:

size_type size() const { return num_elements - num_deleted; }